

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmBrReg1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,ByteCodeLabel labelID,RegSlot R1,int C1)

{
  Data *this_00;
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined4 local_34;
  undefined1 local_30;
  undefined1 auStack_2f [3];
  OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if (((DAT_0159efbd == '\0') && (DAT_0159efbc == '\0')) && (local_30 = (undefined1)R1, R1 < 0x100))
  {
    local_34 = 9;
    _auStack_2f = C1;
    bVar3 = OpCodeUtilAsmJs::IsValidByteCodeOpcode(op);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                  ,0x11,"(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op))",
                                  "OpCodeUtilAsmJs::IsValidByteCodeOpcode(op)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>(this_00,op,&this->super_ByteCodeWriter);
    if ((ushort)(op - StartCall) < 0xfff8) {
      puVar1 = &(this->super_ByteCodeWriter).m_byteCodeWithoutLDACount;
      *puVar1 = *puVar1 + 1;
    }
    ByteCodeWriter::IncreaseByteCodeCount(&this->super_ByteCodeWriter);
    ByteCodeWriter::Data::Write(this_00,&local_34,9);
    AddJumpOffset(this,EndOfBlock,labelID,9);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmBrReg1Const1(OpCodeAsmJs op, ByteCodeLabel labelID, RegSlot R1, int C1)
    {
        OpLayoutT_BrInt1Const1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.I1, R1) && SizePolicy::Assign(layout.C1, C1))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrInt1Const1<SizePolicy>) - offsetof(OpLayoutT_BrInt1Const1<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }